

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example1.cpp
# Opt level: O1

bool verifyResult(string *objI,string *objJ,double distance,double penetration,Point3 *p1,Point3 *p2
                 )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  long *plVar5;
  long *plVar6;
  size_type *psVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  double pd;
  double dd;
  double local_108;
  double local_100;
  Vector3 local_f8;
  byte local_da;
  byte local_d9;
  Vector3 local_d8;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  double local_40;
  double local_38;
  
  *(undefined8 *)(sch::CD_Scene::sceneProximityQuery + *(long *)(std::cerr + -0x18)) = 0xe;
  local_100 = 0.0;
  local_108 = 0.0;
  local_f8.m_z = 0.0;
  local_f8.m_x = 0.0;
  local_f8.m_y = 0.0;
  local_d8.m_z = 0.0;
  local_d8.m_x = 0.0;
  local_d8.m_y = 0.0;
  local_40 = penetration;
  local_38 = distance;
  iVar4 = std::__cxx11::string::compare((char *)objJ);
  if (iVar4 == 0) {
    iVar4 = std::__cxx11::string::compare((char *)objI);
    if (iVar4 != 0) goto LAB_00103640;
    local_100 = 5.4487471575136;
    local_108 = 5.4487471575136;
    local_f8.m_x = 0.28175284289769;
    local_f8.m_y = -0.14299067182235;
    local_f8.m_z = 1.1716656444909;
    local_d8.m_x = -1.7636106455221;
    uVar8 = 0xc8538d12;
    uVar9 = 0x3ff7a9d0;
    local_d8.m_y = -1.2250286690872;
  }
  else {
LAB_00103640:
    iVar4 = std::__cxx11::string::compare((char *)objJ);
    if (iVar4 == 0) {
      iVar4 = std::__cxx11::string::compare((char *)objI);
      if (iVar4 == 0) {
        local_100 = 0.30421039852355;
        local_108 = 0.30421039852355;
        local_f8.m_x = 0.96363716178523;
        local_f8.m_y = 0.46511130288262;
        local_f8.m_z = -0.52236418422971;
        local_d8.m_x = 0.98382992853513;
        uVar8 = 0x46c42957;
        uVar9 = 0xbff102f1;
        local_d8.m_y = 0.57131577169444;
        goto LAB_00104a12;
      }
    }
    iVar4 = std::__cxx11::string::compare((char *)objJ);
    if (iVar4 == 0) {
      iVar4 = std::__cxx11::string::compare((char *)objI);
      if (iVar4 == 0) {
        local_100 = 9.9181149823984;
        local_108 = 9.9181149823984;
        local_f8.m_x = -2.2982641001418;
        local_f8.m_y = -0.53893477159955;
        local_f8.m_z = 1.0585206046519;
        local_d8.m_x = -0.63840167210456;
        uVar8 = 0xaeeaa549;
        uVar9 = 0xbff9dc95;
        local_d8.m_y = -0.44938462670065;
        goto LAB_00104a12;
      }
    }
    iVar4 = std::__cxx11::string::compare((char *)objJ);
    if (iVar4 == 0) {
      iVar4 = std::__cxx11::string::compare((char *)objI);
      if (iVar4 == 0) {
        local_100 = 0.55758708510798;
        local_108 = 0.55758708510798;
        local_f8.m_x = 0.61084807024591;
        local_f8.m_y = 0.29440863418974;
        local_f8.m_z = 0.069803781161034;
        local_d8.m_x = -0.056687617849561;
        uVar8 = 0xe1df3814;
        uVar9 = 0xbfccc754;
        local_d8.m_y = 0.13575086229484;
        goto LAB_00104a12;
      }
    }
    iVar4 = std::__cxx11::string::compare((char *)objJ);
    if (iVar4 == 0) {
      iVar4 = std::__cxx11::string::compare((char *)objI);
      if (iVar4 == 0) {
        local_100 = 5.9443143905268;
        local_108 = 5.9443143905268;
        local_f8.m_x = -2.1732498476818;
        local_f8.m_y = -0.63004749575528;
        local_f8.m_z = 1.1490992568704;
        local_d8.m_x = -0.27631829569933;
        uVar8 = 0xdfdb1307;
        uVar9 = 0xbfc7b150;
        local_d8.m_y = 0.12220296114932;
        goto LAB_00104a12;
      }
    }
    iVar4 = std::__cxx11::string::compare((char *)objJ);
    if (iVar4 == 0) {
      iVar4 = std::__cxx11::string::compare((char *)objI);
      if (iVar4 == 0) {
        local_100 = 0.51584655618165;
        local_108 = 0.51584655618165;
        local_f8.m_x = 0.12785132793314;
        local_f8.m_y = 0.015765330308717;
        local_f8.m_z = -1.2847741886342;
        local_d8.m_x = -0.12368170430067;
        uVar8 = 0x61a2d4d8;
        uVar9 = 0xbfe3ad45;
        local_d8.m_y = 0.077797038850676;
        goto LAB_00104a12;
      }
    }
    iVar4 = std::__cxx11::string::compare((char *)objJ);
    if (iVar4 == 0) {
      iVar4 = std::__cxx11::string::compare((char *)objI);
      if (iVar4 == 0) {
        local_100 = 2.78972586142;
        local_108 = 2.78972586142;
        local_f8.m_x = 0.27677566692662;
        local_f8.m_y = -0.13314609360976;
        local_f8.m_z = 1.1658328403376;
        local_d8.m_x = -1.2995880118717;
        uVar8 = 0x72b36357;
        uVar9 = 0x3ff805c1;
        local_d8.m_y = -0.57154615294118;
        goto LAB_00104a12;
      }
    }
    iVar4 = std::__cxx11::string::compare((char *)objJ);
    if (iVar4 == 0) {
      iVar4 = std::__cxx11::string::compare((char *)objI);
      if (iVar4 == 0) {
        local_108 = 0.0;
        local_100 = -0.31718567003746;
        local_f8.m_x = -1.787265308154;
        local_f8.m_y = -1.1960497354292;
        local_f8.m_z = 1.4450521781144;
        local_d8.m_x = -2.2686354608106;
        uVar8 = 0xbeb3f8aa;
        uVar9 = 0x3ffadf44;
        local_d8.m_y = -1.3706878827971;
        goto LAB_00104a12;
      }
    }
    iVar4 = std::__cxx11::string::compare((char *)objJ);
    if (iVar4 == 0) {
      iVar4 = std::__cxx11::string::compare((char *)objI);
      if (iVar4 == 0) {
        local_100 = 3.440763819841;
        local_108 = 3.440763819841;
        local_f8.m_x = -0.83748878593566;
        local_f8.m_y = -0.54621539306324;
        local_f8.m_z = -1.7742688055859;
        local_d8.m_x = -2.060158969655;
        uVar8 = 0x43756b67;
        uVar9 = 0xbfdc557d;
        local_d8.m_y = -0.96192382874358;
        goto LAB_00104a12;
      }
    }
    iVar4 = std::__cxx11::string::compare((char *)objJ);
    if (iVar4 == 0) {
      iVar4 = std::__cxx11::string::compare((char *)objI);
      if (iVar4 == 0) {
        local_100 = 3.1102603339576;
        local_108 = 3.1102603339576;
        local_f8.m_x = -0.27631829569933;
        local_f8.m_y = 0.12220296114932;
        local_f8.m_z = -0.18509875231225;
        local_d8.m_x = -1.6979671687682;
        uVar8 = 0x463c8126;
        uVar9 = 0x3fe2849b;
        local_d8.m_y = -0.58899718550305;
        goto LAB_00104a12;
      }
    }
    iVar4 = std::__cxx11::string::compare((char *)objJ);
    if (iVar4 == 0) {
      iVar4 = std::__cxx11::string::compare((char *)objI);
      if (iVar4 == 0) {
        local_100 = 0.14762346168417;
        local_108 = 0.14762346168417;
        local_f8.m_x = 0.29961124339566;
        local_f8.m_y = 0.014926401743127;
        local_f8.m_z = 0.97819026233414;
        local_d8.m_x = -0.067084392233482;
        uVar8 = 0x103e780f;
        uVar9 = 0x3fed5645;
        local_d8.m_y = 0.11181124267447;
        goto LAB_00104a12;
      }
    }
    iVar4 = std::__cxx11::string::compare((char *)objJ);
    if (iVar4 == 0) {
      iVar4 = std::__cxx11::string::compare((char *)objI);
      if (iVar4 == 0) {
        local_108 = 0.0;
        local_100 = -0.88486848336054;
        local_f8.m_x = -1.8258028062901;
        local_f8.m_y = -1.2035457346373;
        local_f8.m_z = 1.5672994449862;
        local_d8.m_x = -2.0099706249296;
        uVar8 = 0xe7aa6866;
        uVar9 = 0x3fe8d2ef;
        local_d8.m_y = -1.6772532880947;
        goto LAB_00104a12;
      }
    }
    iVar4 = std::__cxx11::string::compare((char *)objJ);
    if (iVar4 == 0) {
      iVar4 = std::__cxx11::string::compare((char *)objI);
      if (iVar4 == 0) {
        local_100 = 1.2943618702035;
        local_108 = 1.2943618702035;
        local_f8.m_x = -0.2536866871953;
        local_f8.m_y = -0.23957739656524;
        local_f8.m_z = -1.4216076267573;
        local_d8.m_x = -0.65088388966599;
        uVar8 = 0xe2ff1ef3;
        uVar9 = 0xbfd6e807;
        local_d8.m_y = -0.31132657081448;
        goto LAB_00104a12;
      }
    }
    iVar4 = std::__cxx11::string::compare((char *)objJ);
    if (iVar4 == 0) {
      iVar4 = std::__cxx11::string::compare((char *)objI);
      if (iVar4 == 0) {
        local_100 = 0.16648542041871;
        local_108 = 0.16648542041871;
        local_f8.m_x = -0.27631829569933;
        local_f8.m_y = 0.12220296114932;
        local_f8.m_z = -0.18509875231225;
        local_d8.m_x = -0.54770561715496;
        uVar8 = 0x929a601d;
        uVar9 = 0x3f8f767b;
        local_d8.m_y = -0.10725192694837;
        goto LAB_00104a12;
      }
    }
    iVar4 = std::__cxx11::string::compare((char *)objJ);
    if (iVar4 == 0) {
      iVar4 = std::__cxx11::string::compare((char *)objI);
      if (iVar4 == 0) {
        local_108 = 0.0;
        local_100 = -1.7306786763394;
        local_f8.m_x = -1.1518981590561;
        local_f8.m_y = -1.0179317129611;
        local_f8.m_z = 1.6120145906702;
        local_d8.m_x = -2.0999010779384;
        uVar8 = 0xb1ac80c5;
        uVar9 = 0x3ff50f3b;
        local_d8.m_y = -0.15510256812534;
        goto LAB_00104a12;
      }
    }
    iVar4 = std::__cxx11::string::compare((char *)objJ);
    if (iVar4 == 0) {
      iVar4 = std::__cxx11::string::compare((char *)objI);
      if (iVar4 == 0) {
        local_100 = 5.3186326388713;
        local_108 = 5.3186326388713;
        local_f8.m_x = 0.3354800425203;
        local_f8.m_y = 0.22033997371372;
        local_f8.m_z = 1.0949514789063;
        local_d8.m_x = -1.8196178883092;
        uVar8 = 0x4cc3d487;
        uVar9 = 0x3feaae5b;
        local_d8.m_y = 0.99878520299519;
        goto LAB_00104a12;
      }
    }
    iVar4 = std::__cxx11::string::compare((char *)objJ);
    if (iVar4 == 0) {
      iVar4 = std::__cxx11::string::compare((char *)objI);
      if (iVar4 == 0) {
        local_100 = 1.4183711535435;
        local_108 = 1.4183711535435;
        local_f8.m_x = -2.4779023328493;
        local_f8.m_y = -0.32669997190278;
        local_f8.m_z = 1.0113296028496;
        local_d8.m_x = -2.1762353652203;
        uVar8 = 0x218cc55d;
        uVar9 = 0x3feaf534;
        local_d8.m_y = 0.8129674455965;
        goto LAB_00104a12;
      }
    }
    iVar4 = std::__cxx11::string::compare((char *)objJ);
    if (iVar4 == 0) {
      iVar4 = std::__cxx11::string::compare((char *)objI);
      if (iVar4 == 0) {
        local_100 = 7.4743489107843;
        local_108 = 7.4743489107843;
        local_f8.m_x = -0.53702693775031;
        local_f8.m_y = 0.31921777729824;
        local_f8.m_z = -1.6803624586656;
        local_d8.m_x = -1.9453484492689;
        uVar8 = 0x9f9584d5;
        uVar9 = 0x3fe1c0da;
        local_d8.m_y = 1.0228264075222;
        goto LAB_00104a12;
      }
    }
    iVar4 = std::__cxx11::string::compare((char *)objJ);
    if (iVar4 == 0) {
      iVar4 = std::__cxx11::string::compare((char *)objI);
      if (iVar4 == 0) {
        local_100 = 3.9663117059915;
        local_108 = 3.9663117059915;
        local_f8.m_x = -0.26442597555482;
        local_f8.m_y = 0.15199775567757;
        local_f8.m_z = -0.19156797444484;
        local_d8.m_x = -1.8596364794099;
        uVar8 = 0x7d61ae2b;
        uVar9 = 0x3fe5735a;
        local_d8.m_y = 0.9758575176791;
        goto LAB_00104a12;
      }
    }
    iVar4 = std::__cxx11::string::compare((char *)objJ);
    if (iVar4 == 0) {
      iVar4 = std::__cxx11::string::compare((char *)objI);
      if (iVar4 == 0) {
        local_100 = 1.7772851599536;
        local_108 = 1.7772851599536;
        local_f8.m_x = -1.6006569697181;
        local_f8.m_y = -0.40929377232158;
        local_f8.m_z = 1.1739828310352;
        local_d8.m_x = -2.0082863828167;
        uVar8 = 0x46baea47;
        uVar9 = 0x3febcc5d;
        local_d8.m_y = 0.82274676021845;
        goto LAB_00104a12;
      }
    }
    iVar4 = std::__cxx11::string::compare((char *)objJ);
    if (iVar4 == 0) {
      iVar4 = std::__cxx11::string::compare((char *)objI);
      if (iVar4 == 0) {
        local_100 = 0.40873492947483;
        local_108 = 0.40873492947483;
        local_f8.m_x = -1.4233798793513;
        local_f8.m_y = 0.48324374143217;
        local_f8.m_z = 1.0100607143038;
        local_d8.m_x = -1.883840797678;
        uVar8 = 0x3980f556;
        uVar9 = 0x3febc15e;
        local_d8.m_y = 0.90317898477367;
        goto LAB_00104a12;
      }
    }
    iVar4 = std::__cxx11::string::compare((char *)objJ);
    if (iVar4 == 0) {
      iVar4 = std::__cxx11::string::compare((char *)objI);
      if (iVar4 == 0) {
        local_100 = 0.039104898627535;
        local_108 = 0.039104898627535;
        local_f8.m_x = 1.6781720909763;
        local_f8.m_y = 0.57648753892597;
        local_f8.m_z = -0.21331741131897;
        local_d8.m_x = 1.7976914901379;
        uVar8 = 0x304d6ad5;
        uVar9 = 0xbfd1096b;
        local_d8.m_y = 0.7248905617555;
        goto LAB_00104a12;
      }
    }
    iVar4 = std::__cxx11::string::compare((char *)objJ);
    if (iVar4 == 0) {
      iVar4 = std::__cxx11::string::compare((char *)objI);
      if (iVar4 == 0) {
        local_100 = 18.906059441351;
        local_108 = 18.906059441351;
        local_f8.m_x = -2.0166352552171;
        local_f8.m_y = -0.84324192220842;
        local_f8.m_z = 1.2677212945354;
        local_d8.m_x = 1.6754467644156;
        uVar8 = 0x8b9c95f5;
        uVar9 = 0xbfcd2f04;
        local_d8.m_y = 0.89957633685848;
        goto LAB_00104a12;
      }
    }
    iVar4 = std::__cxx11::string::compare((char *)objJ);
    if (iVar4 == 0) {
      iVar4 = std::__cxx11::string::compare((char *)objI);
      if (iVar4 == 0) {
        local_100 = 0.096550440397139;
        local_108 = 0.096550440397139;
        local_f8.m_x = 1.6697745078346;
        local_f8.m_y = 1.1266310160472;
        local_f8.m_z = -1.0866387839319;
        local_d8.m_x = 1.8346899699717;
        uVar8 = 0x2da09272;
        uVar9 = 0xbfea5a04;
        local_d8.m_y = 1.116376050407;
        goto LAB_00104a12;
      }
    }
    iVar4 = std::__cxx11::string::compare((char *)objJ);
    if (iVar4 == 0) {
      iVar4 = std::__cxx11::string::compare((char *)objI);
      if (iVar4 == 0) {
        local_100 = 3.4928506703209;
        local_108 = 3.4928506703209;
        local_f8.m_x = -0.056687617849561;
        local_f8.m_y = 0.13575086229484;
        local_f8.m_z = -0.22483311680702;
        local_d8.m_x = 1.6443705367279;
        uVar8 = 0x10a17636;
        uVar9 = 0xbfd73e97;
        local_d8.m_y = 0.89739891750289;
        goto LAB_00104a12;
      }
    }
    iVar4 = std::__cxx11::string::compare((char *)objJ);
    if (iVar4 == 0) {
      iVar4 = std::__cxx11::string::compare((char *)objI);
      if (iVar4 == 0) {
        local_100 = 13.535796551098;
        local_108 = 13.535796551098;
        local_f8.m_x = -1.4206285779347;
        local_f8.m_y = -0.3034386790228;
        local_f8.m_z = 1.3608007525762;
        local_d8.m_x = 1.679309305274;
        uVar8 = 0x2c3c2752;
        uVar9 = 0xbfc8360c;
        local_d8.m_y = 0.93099892363515;
        goto LAB_00104a12;
      }
    }
    iVar4 = std::__cxx11::string::compare((char *)objJ);
    if (iVar4 == 0) {
      iVar4 = std::__cxx11::string::compare((char *)objI);
      if (iVar4 == 0) {
        local_100 = 4.9068928394991;
        local_108 = 4.9068928394991;
        local_f8.m_x = -0.10352367186681;
        local_f8.m_y = 0.018083890456479;
        local_f8.m_z = 0.76016554875608;
        local_d8.m_x = 1.6940746685943;
        uVar8 = 0x84f88ea;
        uVar9 = 0xbfc7dd3f;
        local_d8.m_y = 0.90096107279478;
        goto LAB_00104a12;
      }
    }
    iVar4 = std::__cxx11::string::compare((char *)objJ);
    if (iVar4 == 0) {
      iVar4 = std::__cxx11::string::compare((char *)objI);
      if (iVar4 != 0) goto LAB_00103aae;
      local_100 = 12.731096153983;
      local_108 = 12.731096153983;
      local_f8.m_x = -1.8114862908327;
      local_f8.m_z = 0.71778175614537;
      local_d8.m_x = 1.6191438180545;
      uVar8 = 0x6b0ffa60;
      uVar9 = 0xbfd0d47e;
LAB_00104a0a:
      local_f8.m_y = 1.1;
      local_d8.m_y = 1.1;
    }
    else {
LAB_00103aae:
      iVar4 = std::__cxx11::string::compare((char *)objJ);
      if (iVar4 == 0) {
        iVar4 = std::__cxx11::string::compare((char *)objI);
        if (iVar4 == 0) {
          local_100 = 0.43645502641181;
          local_108 = 0.43645502641181;
          local_f8.m_x = 1.6912459612619;
          local_f8.m_y = 0.567053610651;
          local_f8.m_z = -0.20657129901502;
          local_d8.m_x = 2.158681625653;
          uVar8 = 0x302a814e;
          uVar9 = 0xbfdba0b9;
          local_d8.m_y = 0.97605586976899;
          goto LAB_00104a12;
        }
      }
      iVar4 = std::__cxx11::string::compare((char *)objJ);
      if (iVar4 == 0) {
        iVar4 = std::__cxx11::string::compare((char *)objI);
        if (iVar4 == 0) {
          local_100 = 23.550195655262;
          local_108 = 23.550195655262;
          local_f8.m_x = -1.9924580739264;
          local_f8.m_y = -0.87944172212693;
          local_f8.m_z = 1.2854835093993;
          local_d8.m_x = 2.1300977188898;
          uVar8 = 0x7d7108c3;
          uVar9 = 0xbfdb7a14;
          local_d8.m_y = 1.0216519471083;
          goto LAB_00104a12;
        }
      }
      iVar4 = std::__cxx11::string::compare((char *)objJ);
      if (iVar4 == 0) {
        iVar4 = std::__cxx11::string::compare((char *)objI);
        if (iVar4 == 0) {
          local_100 = 0.42972022695158;
          local_108 = 0.42972022695158;
          local_f8.m_x = 1.7058063536863;
          local_f8.m_y = 1.1636066171891;
          local_f8.m_z = -1.112225860713;
          local_d8.m_x = 2.1610693162235;
          uVar8 = 0x519621f2;
          uVar9 = 0xbfe49451;
          local_d8.m_y = 1.1148044581997;
          goto LAB_00104a12;
        }
      }
      iVar4 = std::__cxx11::string::compare((char *)objJ);
      if (iVar4 == 0) {
        iVar4 = std::__cxx11::string::compare((char *)objI);
        if (iVar4 == 0) {
          local_100 = 5.5750152536297;
          local_108 = 5.5750152536297;
          local_f8.m_x = -0.056687617849561;
          local_f8.m_y = 0.13575086229484;
          local_f8.m_z = -0.22483311680702;
          local_d8.m_x = 2.1157485332466;
          uVar8 = 0xb1c4cd55;
          uVar9 = 0xbfdea240;
          local_d8.m_y = 1.0251955369043;
          goto LAB_00104a12;
        }
      }
      iVar4 = std::__cxx11::string::compare((char *)objJ);
      if (iVar4 == 0) {
        iVar4 = std::__cxx11::string::compare((char *)objI);
        if (iVar4 == 0) {
          local_100 = 17.558511336885;
          local_108 = 17.558511336885;
          local_f8.m_x = -1.4288100961977;
          local_f8.m_y = -0.31186268568159;
          local_f8.m_z = 1.3377283222371;
          local_d8.m_x = 2.130156805579;
          uVar8 = 0xc9ac886c;
          uVar9 = 0xbfdaa436;
          local_d8.m_y = 1.0356334715405;
          goto LAB_00104a12;
        }
      }
      iVar4 = std::__cxx11::string::compare((char *)objJ);
      if (iVar4 == 0) {
        iVar4 = std::__cxx11::string::compare((char *)objI);
        if (iVar4 == 0) {
          local_100 = 7.4049800506603;
          local_108 = 7.4049800506603;
          local_f8.m_x = -0.11233115341526;
          local_f8.m_y = -0.0045702874952087;
          local_f8.m_z = 0.72231113656579;
          local_d8.m_x = 2.1346488277106;
          uVar8 = 0x35c52031;
          uVar9 = 0xbfdaa6e5;
          local_d8.m_y = 1.0246599452678;
          goto LAB_00104a12;
        }
      }
      iVar4 = std::__cxx11::string::compare((char *)objJ);
      if (iVar4 == 0) {
        iVar4 = std::__cxx11::string::compare((char *)objI);
        if (iVar4 == 0) {
          local_100 = 16.711972710807;
          local_108 = 16.711972710807;
          local_f8.m_x = -1.8123385444469;
          local_f8.m_z = 0.71484785975054;
          local_d8.m_x = 2.1082256962979;
          uVar8 = 0x5bbd9e1f;
          uVar9 = 0xbfdc5de9;
          goto LAB_00104a0a;
        }
      }
      iVar4 = std::__cxx11::string::compare((char *)objJ);
      if (iVar4 != 0) goto LAB_00104a1e;
      iVar4 = std::__cxx11::string::compare((char *)objI);
      if (iVar4 != 0) goto LAB_00104a1e;
      local_108 = 0.0;
      local_100 = -0.22676975704217;
      local_f8.m_x = 2.5376620746762;
      local_f8.m_y = 1.098724063024;
      local_f8.m_z = -0.64109671750724;
      local_d8.m_x = 2.1249351701295;
      uVar8 = 0xd45037d3;
      uVar9 = 0xbfd9d3f2;
      local_d8.m_y = 1.1005103747904;
    }
  }
LAB_00104a12:
  local_d8.m_z = (double)CONCAT44(uVar9,uVar8);
LAB_00104a1e:
  std::operator+(&local_60,"distance (",objI);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_60);
  plVar6 = plVar5 + 2;
  if ((long *)*plVar5 == plVar6) {
    local_90 = *plVar6;
    lStack_88 = plVar5[3];
    local_a0 = &local_90;
  }
  else {
    local_90 = *plVar6;
    local_a0 = (long *)*plVar5;
  }
  local_98 = plVar5[1];
  *plVar5 = (long)plVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_a0,(ulong)(objJ->_M_dataplus)._M_p);
  local_c0 = &local_b0;
  plVar6 = plVar5 + 2;
  if ((long *)*plVar5 == plVar6) {
    local_b0 = *plVar6;
    lStack_a8 = plVar5[3];
  }
  else {
    local_b0 = *plVar6;
    local_c0 = (long *)*plVar5;
  }
  local_b8 = plVar5[1];
  *plVar5 = (long)plVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_c0);
  paVar1 = &local_80.field_2;
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_80.field_2._M_allocated_capacity = *psVar7;
    local_80.field_2._8_8_ = plVar5[3];
    local_80._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_80.field_2._M_allocated_capacity = *psVar7;
    local_80._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_80._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_d9 = compare<double>(&local_38,&local_100,&local_80,1e-06);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_60,"penetration (",objI);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_60);
  plVar6 = plVar5 + 2;
  if ((long *)*plVar5 == plVar6) {
    local_90 = *plVar6;
    lStack_88 = plVar5[3];
    local_a0 = &local_90;
  }
  else {
    local_90 = *plVar6;
    local_a0 = (long *)*plVar5;
  }
  local_98 = plVar5[1];
  *plVar5 = (long)plVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_a0,(ulong)(objJ->_M_dataplus)._M_p);
  local_c0 = &local_b0;
  plVar6 = plVar5 + 2;
  if ((long *)*plVar5 == plVar6) {
    local_b0 = *plVar6;
    lStack_a8 = plVar5[3];
  }
  else {
    local_b0 = *plVar6;
    local_c0 = (long *)*plVar5;
  }
  local_b8 = plVar5[1];
  *plVar5 = (long)plVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_c0);
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_80.field_2._M_allocated_capacity = *psVar7;
    local_80.field_2._8_8_ = plVar5[3];
    local_80._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_80.field_2._M_allocated_capacity = *psVar7;
    local_80._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_80._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_da = compare<double>(&local_40,&local_108,&local_80,1e-06);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_60,"p1 (",objI);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_60);
  local_a0 = &local_90;
  plVar6 = plVar5 + 2;
  if ((long *)*plVar5 == plVar6) {
    local_90 = *plVar6;
    lStack_88 = plVar5[3];
  }
  else {
    local_90 = *plVar6;
    local_a0 = (long *)*plVar5;
  }
  local_98 = plVar5[1];
  *plVar5 = (long)plVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_a0,(ulong)(objJ->_M_dataplus)._M_p);
  local_c0 = &local_b0;
  plVar6 = plVar5 + 2;
  if ((long *)*plVar5 == plVar6) {
    local_b0 = *plVar6;
    lStack_a8 = plVar5[3];
  }
  else {
    local_b0 = *plVar6;
    local_c0 = (long *)*plVar5;
  }
  local_b8 = plVar5[1];
  *plVar5 = (long)plVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_c0);
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_80.field_2._M_allocated_capacity = *psVar7;
    local_80.field_2._8_8_ = plVar5[3];
    local_80._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_80.field_2._M_allocated_capacity = *psVar7;
    local_80._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_80._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  bVar2 = compare(p1,&local_f8,&local_80,1e-06);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_60,"p2 (",objI);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_60);
  plVar6 = plVar5 + 2;
  if ((long *)*plVar5 == plVar6) {
    local_90 = *plVar6;
    lStack_88 = plVar5[3];
    local_a0 = &local_90;
  }
  else {
    local_90 = *plVar6;
    local_a0 = (long *)*plVar5;
  }
  local_98 = plVar5[1];
  *plVar5 = (long)plVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_a0,(ulong)(objJ->_M_dataplus)._M_p);
  local_c0 = &local_b0;
  plVar6 = plVar5 + 2;
  if ((long *)*plVar5 == plVar6) {
    local_b0 = *plVar6;
    lStack_a8 = plVar5[3];
  }
  else {
    local_b0 = *plVar6;
    local_c0 = (long *)*plVar5;
  }
  local_b8 = plVar5[1];
  *plVar5 = (long)plVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_c0);
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_80.field_2._M_allocated_capacity = *psVar7;
    local_80.field_2._8_8_ = plVar5[3];
    local_80._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_80.field_2._M_allocated_capacity = *psVar7;
    local_80._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_80._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  bVar3 = compare(p2,&local_d8,&local_80,1e-06);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return (bool)((bVar2 && bVar3) & local_d9 & local_da);
}

Assistant:

bool verifyResult(const std::string & objI, const std::string & objJ,
                  double distance, double penetration,
                  const Point3 & p1, const Point3 & p2)
{
  std::cerr.precision(14);

  double dd(0);
  double pd(0);
  Point3 dp1(0, 0, 0);
  Point3 dp2(0, 0, 0);

  if(objJ == "super1" && objI == "super2")
  {
    dd = 5.4487471575136;
    pd = 5.4487471575136;
    dp1.Set(0.28175284289769, -0.14299067182235, 1.1716656444909);
    dp2.Set(-1.7636106455221, -1.2250286690872, 1.4789588761567);
  }
  else if(objJ == "super1" && objI == "super3")
  {
    dd = 0.30421039852355;
    pd = 0.30421039852355;
    dp1.Set(0.96363716178523, 0.46511130288262, -0.52236418422971);
    dp2.Set(0.98382992853513, 0.57131577169444, -1.0632183803851);
  }
  else if(objJ == "super2" && objI == "super3")
  {
    dd = 9.9181149823984;
    pd = 9.9181149823984;
    dp1.Set(-2.2982641001418, -0.53893477159955, 1.0585206046519);
    dp2.Set(-0.63840167210456, -0.44938462670065, -1.6163536865882);
  }
  else if(objJ == "super1" && objI == "box1")
  {
    dd = 0.55758708510798;
    pd = 0.55758708510798;
    dp1.Set(0.61084807024591, 0.29440863418974, 0.069803781161034);
    dp2.Set(-0.056687617849561, 0.13575086229484, -0.22483311680702);
  }
  else if(objJ == "super2" && objI == "box1")
  {
    dd = 5.9443143905268;
    pd = 5.9443143905268;
    dp1.Set(-2.1732498476818, -0.63004749575528, 1.1490992568704);
    dp2.Set(-0.27631829569933, 0.12220296114932, -0.18509875231225);
  }
  else if(objJ == "super3" && objI == "box1")
  {
    dd = 0.51584655618165;
    pd = 0.51584655618165;
    dp1.Set(0.12785132793314, 0.015765330308717, -1.2847741886342);
    dp2.Set(-0.12368170430067, 0.077797038850676, -0.61490124768775);
  }
  else if(objJ == "super1" && objI == "box2")
  {
    dd = 2.78972586142;
    pd = 2.78972586142;
    dp1.Set(0.27677566692662, -0.13314609360976, 1.1658328403376);
    dp2.Set(-1.2995880118717, -0.57154615294118, 1.5014051895616);
  }
  else if(objJ == "super2" && objI == "box2")
  {
    pd = 0;
#ifdef SCH_BUILD_BSD
    dd = 0;
    dp1.Set(-2.4382016429023, -0.34453137974329, 1.0149926815109);
    dp2.Set(-2.8034902987202, -1.9213950463338, 0.1711823973004);
#else
    dd = -0.31718567003746;
    dp1.Set(-1.787265308154, -1.1960497354292, 1.4450521781144);
    dp2.Set(-2.2686354608106, -1.3706878827971, 1.6795089196526);
#endif
  }
  else if(objJ == "super3" && objI == "box2")
  {
    dd = 3.440763819841;
    pd = 3.440763819841;
    dp1.Set(-0.83748878593566, -0.54621539306324, -1.7742688055859);
    dp2.Set(-2.060158969655, -0.96192382874358, -0.44271785342942);
  }
  else if(objJ == "box1" && objI == "box2")
  {
    dd = 3.1102603339576;
    pd = 3.1102603339576;
    dp1.Set(-0.27631829569933, 0.12220296114932, -0.18509875231225);
    dp2.Set(-1.6979671687682, -0.58899718550305, 0.57868732183491);
  }
  else if(objJ == "super1" && objI == "box3")
  {
    dd = 0.14762346168417;
    pd = 0.14762346168417;
    dp1.Set(0.29961124339566, 0.014926401743127, 0.97819026233414);
    dp2.Set(-0.067084392233482, 0.11181124267447, 0.91678097889576);
  }
  else if(objJ == "super2" && objI == "box3")
  {
    pd = 0;
#ifdef SCH_BUILD_BSD
    dd = 0;
    dp1.Set(-1.9129702551419, -1.8621316732081, 1.5487339817517);
    dp2.Set(-3.6588197853564, -1.4067952284442, 2.6612783998353);
#else
    dd = -0.88486848336054;
    dp1.Set(-1.8258028062901, -1.2035457346373, 1.5672994449862);
    dp2.Set(-2.0099706249296, -1.6772532880947, 0.77574916121672);
#endif
  }
  else if(objJ == "super3" && objI == "box3")
  {
    dd = 1.2943618702035;
    pd = 1.2943618702035;
    dp1.Set(-0.2536866871953, -0.23957739656524, -1.4216076267573);
    dp2.Set(-0.65088388966599, -0.31132657081448, -0.35791203658708);
  }
  else if(objJ == "box1" && objI == "box3")
  {
    dd = 0.16648542041871;
    pd = 0.16648542041871;
    dp1.Set(-0.27631829569933, 0.12220296114932, -0.18509875231225);
    dp2.Set(-0.54770561715496, -0.10725192694837, 0.015362706576795);
  }
  else if(objJ == "box2" && objI == "box3")
  {
    pd = 0;
#ifdef SCH_BUILD_BSD
    dd = 0;
    dp1.Set(-2.060158969655, -0.96192382874358, -0.44271785342942);
    dp2.Set(-2.7940854586392, -2.1938370874621, 2.9310925142747);
#else
    dd = -1.7306786763394;
    dp1.Set(-1.1518981590561, -1.0179317129611, 1.6120145906702);
    dp2.Set(-2.0999010779384, -0.15510256812534, 1.3162190380463);
#endif
  }
  else if(objJ == "super1" && objI == "sphere1")
  {
    dd = 5.3186326388713;
    pd = 5.3186326388713;
    dp1.Set(0.3354800425203, 0.22033997371372, 1.0949514789063);
    dp2.Set(-1.8196178883092, 0.99878520299519, 0.83378376954228);
  }
  else if(objJ == "super2" && objI == "sphere1")
  {
    dd = 1.4183711535435;
    pd = 1.4183711535435;
    dp1.Set(-2.4779023328493, -0.32669997190278, 1.0113296028496);
    dp2.Set(-2.1762353652203, 0.8129674455965, 0.84243208458626);
  }
  else if(objJ == "super3" && objI == "sphere1")
  {
    dd = 7.4743489107843;
    pd = 7.4743489107843;
    dp1.Set(-0.53702693775031, 0.31921777729824, -1.6803624586656);
    dp2.Set(-1.9453484492689, 1.0228264075222, 0.55479174774896);
  }
  else if(objJ == "box1" && objI == "sphere1")
  {
    dd = 3.9663117059915;
    pd = 3.9663117059915;
    dp1.Set(-0.26442597555482, 0.15199775567757, -0.19156797444484);
    dp2.Set(-1.8596364794099, 0.9758575176791, 0.6703312348231);
  }
  else if(objJ == "box2" && objI == "sphere1")
  {
    dd = 1.7772851599536;
    pd = 1.7772851599536;
    dp1.Set(-1.6006569697181, -0.40929377232158, 1.1739828310352);
    dp2.Set(-2.0082863828167, 0.82274676021845, 0.86869682135086);
  }
  else if(objJ == "box3" && objI == "sphere1")
  {
    dd = 0.40873492947483;
    pd = 0.40873492947483;
    dp1.Set(-1.4233798793513, 0.48324374143217, 1.0100607143038);
    dp2.Set(-1.883840797678, 0.90317898477367, 0.86735450011444);
  }
  else if(objJ == "super1" && objI == "sphere2")
  {
    dd = 0.039104898627535;
    pd = 0.039104898627535;
    dp1.Set(1.6781720909763, 0.57648753892597, -0.21331741131897);
    dp2.Set(1.7976914901379, 0.7248905617555, -0.26619987217934);
  }
  else if(objJ == "super2" && objI == "sphere2")
  {
    dd = 18.906059441351;
    pd = 18.906059441351;
    dp1.Set(-2.0166352552171, -0.84324192220842, 1.2677212945354);
    dp2.Set(1.6754467644156, 0.89957633685848, -0.22799736802078);
  }
  else if(objJ == "super3" && objI == "sphere2")
  {
    dd = 0.096550440397139;
    pd = 0.096550440397139;
    dp1.Set(1.6697745078346, 1.1266310160472, -1.0866387839319);
    dp2.Set(1.8346899699717, 1.116376050407, -0.82348832046098);
  }
  else if(objJ == "box1" && objI == "sphere2")
  {
    dd = 3.4928506703209;
    pd = 3.4928506703209;
    dp1.Set(-0.056687617849561, 0.13575086229484, -0.22483311680702);
    dp2.Set(1.6443705367279, 0.89739891750289, -0.3631951963815);
  }
  else if(objJ == "box2" && objI == "sphere2")
  {
    dd = 13.535796551098;
    pd = 13.535796551098;
    dp1.Set(-1.4206285779347, -0.3034386790228, 1.3608007525762);
    dp2.Set(1.679309305274, 0.93099892363515, -0.18914940032874);
  }
  else if(objJ == "box3" && objI == "sphere2")
  {
    dd = 4.9068928394991;
    pd = 4.9068928394991;
    dp1.Set(-0.10352367186681, 0.018083890456479, 0.76016554875608);
    dp2.Set(1.6940746685943, 0.90096107279478, -0.18643939882083);
  }
  else if(objJ == "sphere1" && objI == "sphere2")
  {
    dd = 12.731096153983;
    pd = 12.731096153983;
    dp1.Set(-1.8114862908327, 1.1, 0.71778175614537);
    dp2.Set(1.6191438180545, 1.1, -0.26296959357561);
  }
  else if(objJ == "super1" && objI == "sphere3")
  {
    dd = 0.43645502641181;
    pd = 0.43645502641181;
    dp1.Set(1.6912459612619, 0.567053610651, -0.20657129901502);
    dp2.Set(2.158681625653, 0.97605586976899, -0.43168477729525);
  }
  else if(objJ == "super2" && objI == "sphere3")
  {
    dd = 23.550195655262;
    pd = 23.550195655262;
    dp1.Set(-1.9924580739264, -0.87944172212693, 1.2854835093993);
    dp2.Set(2.1300977188898, 1.0216519471083, -0.42932617426062);
  }
  else if(objJ == "super3" && objI == "sphere3")
  {
    dd = 0.42972022695158;
    pd = 0.42972022695158;
    dp1.Set(1.7058063536863, 1.1636066171891, -1.112225860713);
    dp2.Set(2.1610693162235, 1.1148044581997, -0.64310518202643);
  }
  else if(objJ == "box1" && objI == "sphere3")
  {
    dd = 5.5750152536297;
    pd = 5.5750152536297;
    dp1.Set(-0.056687617849561, 0.13575086229484, -0.22483311680702);
    dp2.Set(2.1157485332466, 1.0251955369043, -0.47865311966162);
  }
  else if(objJ == "box2" && objI == "sphere3")
  {
    dd = 17.558511336885;
    pd = 17.558511336885;
    dp1.Set(-1.4288100961977, -0.31186268568159, 1.3377283222371);
    dp2.Set(2.130156805579, 1.0356334715405, -0.41627282805178);
  }
  else if(objJ == "box3" && objI == "sphere3")
  {
    dd = 7.4049800506603;
    pd = 7.4049800506603;
    dp1.Set(-0.11233115341526, -0.0045702874952087, 0.72231113656579);
    dp2.Set(2.1346488277106, 1.0246599452678, -0.41643648386935);
  }
  else if(objJ == "sphere1" && objI == "sphere3")
  {
    dd = 16.711972710807;
    pd = 16.711972710807;
    dp1.Set(-1.8123385444469, 1.1, 0.71484785975054);
    dp2.Set(2.1082256962979, 1.1, -0.44323190650036);
  }
  else if(objJ == "sphere2" && objI == "sphere3")
  {
    pd = 0;
#ifdef SCH_BUILD_BSD
    dd = 0;
    dp1.Set(2.1492688089833, 1.1, -0.89756666333404);
    dp2.Set(2.2802924764067, 1.1, -0.30097333466639);
#else
    dd = -0.22676975704217;
    dp1.Set(2.5376620746762, 1.098724063024, -0.64109671750724);
    dp2.Set(2.1249351701295, 1.1005103747904, -0.40356131299711);
#endif
  }

  bool res = true;

  double epsilon = 1e-6;
  double pepsilon = epsilon;

#if defined __i386__ || defined __aarch64__
  epsilon = 1e-4;
  pepsilon = 1e-1;
#endif

  res = compare(distance, dd, "distance ("+objI +", "+objJ+"): ", epsilon) && res;
  res = compare(penetration, pd, "penetration ("+objI +", "+objJ+"): ", epsilon) && res;
  res = compare(p1, dp1, "p1 ("+objI +", "+objJ+"): ", pepsilon) && res;
  res = compare(p2, dp2, "p2 ("+objI +", "+objJ+"): ", pepsilon) && res;
  return res;
}